

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

void show_conduct(int final)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *middle;
  char **ppcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  menulist menu;
  char buf [256];
  menulist local_150;
  int local_13c;
  char local_138 [264];
  
  init_menulist(&local_150);
  pcVar7 = "";
  if (final == 0) {
    pcVar7 = "have ";
  }
  ppcVar4 = &conducts[0].failtxt;
  lVar6 = 0;
  local_13c = final;
  do {
    iVar5 = (int)lVar6;
    bVar1 = successful_cdt(iVar5);
    if (bVar1 == '\0') {
      bVar1 = intended_cdt(iVar5);
      if (bVar1 != '\0') {
        pcVar3 = *ppcVar4;
        pcVar8 = "You ";
        middle = pcVar7;
        goto LAB_0015a941;
      }
    }
    else {
      bVar1 = superfluous_cdt(iVar5);
      if (bVar1 == '\0') {
        pcVar8 = ppcVar4[-4];
        pcVar3 = ppcVar4[-1];
        middle = ppcVar4[(ulong)(final != 0) - 3];
LAB_0015a941:
        enlght_line(&local_150,pcVar8,middle,pcVar3);
      }
    }
    lVar6 = lVar6 + 1;
    ppcVar4 = ppcVar4 + 9;
  } while (lVar6 != 10);
  bVar1 = failed_cdt(0);
  iVar5 = local_13c;
  if ((bVar1 != '\0') || (bVar1 = failed_cdt(1), bVar1 != '\0')) {
    if (u.uconduct.killer == 0) {
      pcVar7 = "never ";
      if (iVar5 == 0) {
        pcVar7 = "have never ";
      }
      pcVar8 = "killed a creature";
    }
    else {
      pcVar3 = "s";
      if (u.uconduct.killer == 1) {
        pcVar3 = "";
      }
      pcVar8 = local_138;
      sprintf(pcVar8,"killed %u creature%s",(ulong)u.uconduct.killer,pcVar3);
    }
    enlght_line(&local_150,"You ",pcVar7,pcVar8);
  }
  if (u.uconduct.weaphit == 0) {
    pcVar7 = "never ";
    if (iVar5 == 0) {
      pcVar7 = "have never ";
    }
    pcVar8 = "hit with a wielded weapon";
LAB_0015aa7c:
    enlght_line(&local_150,"You ",pcVar7,pcVar8);
  }
  else if ((iVar5 != 0) || (flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.weaphit == 1) {
      pcVar7 = "";
    }
    pcVar8 = local_138;
    sprintf(pcVar8,"used a wielded weapon %u time%s",(ulong)u.uconduct.weaphit,pcVar7);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    goto LAB_0015aa7c;
  }
  if (u.uconduct.literate != 0 && (iVar5 != 0 || flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.literate == 1) {
      pcVar7 = "";
    }
    sprintf(local_138,"read items or engraved %u time%s",(ulong)u.uconduct.literate,pcVar7);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    enlght_line(&local_150,"You ",pcVar7,local_138);
  }
  if (u.uconduct.armoruses != 0 && (flags.debug != '\0' || iVar5 != 0)) {
    pcVar7 = "s";
    if (u.uconduct.armoruses == 1) {
      pcVar7 = "";
    }
    sprintf(local_138,"put on armor %u time%s",(ulong)u.uconduct.armoruses,pcVar7);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    enlght_line(&local_150,"You ",pcVar7,local_138);
  }
  if ((u.uconduct.unracearmor == 0) && (u.uconduct.armoruses != 0)) {
    sprintf(local_138,"wearing only %s armor",urace.adj);
    pcVar7 = "have been ";
    if (iVar5 != 0) {
      pcVar7 = "were ";
    }
    enlght_line(&local_150,"You ",pcVar7,local_138);
  }
  uVar2 = num_genocides();
  if (uVar2 == 0) {
    pcVar7 = "have never ";
    if (iVar5 != 0) {
      pcVar7 = "never ";
    }
    pcVar8 = "genocided any monsters";
  }
  else {
    pcVar8 = local_138;
    sprintf(pcVar8,"genocided %d type%s of monster%s",(ulong)uVar2);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
  }
  enlght_line(&local_150,"You ",pcVar7,pcVar8);
  if (u.uconduct.polypiles == 0) {
    pcVar7 = "have never ";
    if (iVar5 != 0) {
      pcVar7 = "never ";
    }
    pcVar8 = "polymorphed an object";
LAB_0015aca6:
    enlght_line(&local_150,"You ",pcVar7,pcVar8);
  }
  else if ((iVar5 != 0) || (flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.polypiles == 1) {
      pcVar7 = "";
    }
    pcVar8 = local_138;
    sprintf(pcVar8,"polymorphed %u item%s",(ulong)u.uconduct.polypiles,pcVar7);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    goto LAB_0015aca6;
  }
  if (u.uconduct.polyselfs == 0) {
    pcVar7 = "have never ";
    if (iVar5 != 0) {
      pcVar7 = "never ";
    }
    pcVar8 = "changed form";
LAB_0015ad26:
    enlght_line(&local_150,"You ",pcVar7,pcVar8);
  }
  else if ((iVar5 != 0) || (flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.polyselfs == 1) {
      pcVar7 = "";
    }
    pcVar8 = local_138;
    sprintf(pcVar8,"changed form %u time%s",(ulong)u.uconduct.polyselfs,pcVar7);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    goto LAB_0015ad26;
  }
  if (u.uconduct.wishes == 0) {
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    pcVar8 = "used no wishes";
LAB_0015ae2b:
    enlght_line(&local_150,"You ",pcVar7,pcVar8);
  }
  else {
    pcVar8 = "es";
    pcVar7 = "es";
    if (u.uconduct.wishes == 1) {
      pcVar7 = "";
    }
    sprintf(local_138,"used %u wish%s",(ulong)u.uconduct.wishes,pcVar7);
    pcVar7 = "";
    if (iVar5 == 0) {
      pcVar7 = "have ";
    }
    enlght_line(&local_150,"You ",pcVar7,local_138);
    if (u.uconduct.wishmagic != 0) {
      if (u.uconduct.wishmagic == 1) {
        pcVar8 = "";
      }
      sprintf(local_138,"used %u wish%s for magical items",(ulong)u.uconduct.wishmagic,pcVar8);
      enlght_line(&local_150,"You ",pcVar7,local_138);
    }
    iVar5 = local_13c;
    if (u.uconduct.wisharti == 0) {
      pcVar7 = "have not wished";
      if (local_13c != 0) {
        pcVar7 = "did not wish";
      }
      pcVar8 = " for any artifacts";
      goto LAB_0015ae2b;
    }
  }
  pcVar7 = "have ";
  if (flags.elbereth_enabled == '\0') {
    pcVar8 = "";
    if (iVar5 == 0) {
      pcVar8 = "have ";
    }
    pcVar3 = "abstained from Elbereth\'s help";
  }
  else if (u.uconduct.elbereths == 0) {
    pcVar8 = "have never ";
    if (iVar5 != 0) {
      pcVar8 = "never ";
    }
    pcVar3 = "wrote Elbereth\'s name";
  }
  else {
    pcVar8 = "s";
    if (u.uconduct.elbereths == 1) {
      pcVar8 = "";
    }
    pcVar3 = local_138;
    sprintf(pcVar3," Elbereth\'s name %u time%s",(ulong)u.uconduct.elbereths,pcVar8);
    pcVar8 = "have written";
    if (iVar5 != 0) {
      pcVar8 = "wrote";
    }
  }
  enlght_line(&local_150,"You ",pcVar8,pcVar3);
  if (u.uconduct.bones == 0 || flags.debug == '\0' && iVar5 == 0) {
    if (flags.debug != '\0' || iVar5 != 0) {
      pcVar8 = "have never ";
      if (iVar5 != 0) {
        pcVar8 = "never ";
      }
      pcVar3 = "encountered a bones level";
      goto LAB_0015af63;
    }
  }
  else {
    pcVar8 = "s";
    if (u.uconduct.bones == 1) {
      pcVar8 = "";
    }
    pcVar3 = local_138;
    sprintf(pcVar3,"encountered %u bones level%s",(ulong)u.uconduct.bones,pcVar8);
    pcVar8 = "";
    if (iVar5 == 0) {
      pcVar8 = "have ";
    }
LAB_0015af63:
    enlght_line(&local_150,"You ",pcVar8,pcVar3);
  }
  if (u.uconduct.sokoban != 0 || flags.debug == '\0' && iVar5 == 0) {
    if (flags.debug == '\0' && iVar5 == 0) goto LAB_0015aff8;
    pcVar8 = "s";
    if (u.uconduct.sokoban == 1) {
      pcVar8 = "";
    }
    pcVar3 = local_138;
    sprintf(pcVar3,"used %u Sokoban shortcut%s",(ulong)u.uconduct.sokoban,pcVar8);
    if (iVar5 != 0) {
      pcVar7 = "";
    }
  }
  else {
    pcVar7 = "have never ";
    if (iVar5 != 0) {
      pcVar7 = "never ";
    }
    pcVar3 = "used any Sokoban shortcuts";
  }
  enlght_line(&local_150,"You ",pcVar7,pcVar3);
LAB_0015aff8:
  display_menu(local_150.items,local_150.icount,"Voluntary challenges:",0,(int *)0x0);
  free(local_150.items);
  return;
}

Assistant:

void show_conduct(int final)
{
	char buf[BUFSZ];
	int ngenocided;
	int cdt;
	struct menulist menu;

	/* Create the conduct window */
	init_menulist(&menu);

	/* List all major conducts. */
	for (cdt = FIRST_CONDUCT; cdt <= LAST_CONDUCT; cdt++) {
	    if (successful_cdt(cdt)) {
		if (!superfluous_cdt(cdt)) {
		    enl_msg(&menu,
			    conducts[cdt].prefix,	/* "You "       */
			    conducts[cdt].presenttxt,	/* "have been"  */
			    conducts[cdt].pasttxt,	/* "were"       */
			    conducts[cdt].suffix);	/* "a pacifist" */
		}
	    } else if (intended_cdt(cdt)) {
		/* "pretended to be a pacifist" */
		you_have_X(&menu, conducts[cdt].failtxt);
	    }
	}
	if (failed_cdt(CONDUCT_PACIFISM) || failed_cdt(CONDUCT_SADISM)) {
	    if (u.uconduct.killer == 0) {
		you_have_never(&menu, "killed a creature");
	    } else {
		sprintf(buf, "killed %u creature%s", u.uconduct.killer,
			plur(u.uconduct.killer));
		you_have_X(&menu, buf);
	    }
	}

	/* Now list the remaining statistical details. */

	if (!u.uconduct.weaphit)
	    you_have_never(&menu, "hit with a wielded weapon");
	else if (wizard || final) {
	    sprintf(buf, "used a wielded weapon %u time%s",
		    u.uconduct.weaphit, plur(u.uconduct.weaphit));
	    you_have_X(&menu, buf);
	}

	if ((wizard || final) && u.uconduct.literate) {
	    sprintf(buf, "read items or engraved %u time%s",
		    u.uconduct.literate, plur(u.uconduct.literate));
	    you_have_X(&menu, buf);
	}

	if ((wizard || final) && u.uconduct.armoruses) {
	    sprintf(buf, "put on armor %u time%s",
		    u.uconduct.armoruses, plur(u.uconduct.armoruses));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.unracearmor && u.uconduct.armoruses > 0) {
	    sprintf(buf, "wearing only %s armor", urace.adj);
	    you_have_been(&menu, buf);
	}

	ngenocided = num_genocides();
	if (ngenocided == 0) {
	    you_have_never(&menu, "genocided any monsters");
	} else {
	    sprintf(buf, "genocided %d type%s of monster%s",
		    ngenocided, plur(ngenocided), plur(ngenocided));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.polypiles)
	    you_have_never(&menu, "polymorphed an object");
	else if ((wizard || final)) {
	    sprintf(buf, "polymorphed %u item%s",
		    u.uconduct.polypiles, plur(u.uconduct.polypiles));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.polyselfs)
	    you_have_never(&menu, "changed form");
	else if ((wizard || final)) {
	    sprintf(buf, "changed form %u time%s",
		    u.uconduct.polyselfs, plur(u.uconduct.polyselfs));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.wishes)
	    you_have_X(&menu, "used no wishes");
	else {
	    sprintf(buf, "used %u wish%s",
		    u.uconduct.wishes, (u.uconduct.wishes > 1L) ? "es" : "");
	    you_have_X(&menu, buf);

	    if (u.uconduct.wishmagic) {
		sprintf(buf, "used %u wish%s for magical items",
			u.uconduct.wishmagic, u.uconduct.wishmagic > 1 ? "es" : "");
		you_have_X(&menu, buf);
	    }

	    if (!u.uconduct.wisharti)
		enl_msg(&menu, You_, "have not wished", "did not wish",
			" for any artifacts");
	}

	if (flags.elbereth_enabled) {
	    if (!u.uconduct.elbereths)
		you_have_never(&menu, "wrote Elbereth's name");
	    else {
		sprintf(buf, " Elbereth's name %u time%s",
			u.uconduct.elbereths, plur(u.uconduct.elbereths));
		enl_msg(&menu, You_, "have written", "wrote", buf);
	    }
	} else {
	    you_have_X(&menu, "abstained from Elbereth's help");
	}

	if ((wizard || final) && u.uconduct.bones) {
	    sprintf(buf, "encountered %u bones level%s",
		    u.uconduct.bones, plur(u.uconduct.bones));
	    you_have_X(&menu, buf);
	} else if (wizard || final) {
	    you_have_never(&menu, "encountered a bones level");
	}

	if ((wizard || final) && !u.uconduct.sokoban) {
	    you_have_never(&menu, "used any Sokoban shortcuts");
	} else if (wizard || final) {
	    sprintf(buf, "used %u Sokoban shortcut%s",
		    u.uconduct.sokoban, plur(u.uconduct.sokoban));
	    you_have_X(&menu, buf);
	}

	/* Pop up the window and wait for a key */
	display_menu(menu.items, menu.icount, "Voluntary challenges:", PICK_NONE, NULL);
	free(menu.items);
}